

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

void Js::AsmJSByteCodeGenerator::EmitEmptyByteCode
               (FuncInfo *funcInfo,ByteCodeGenerator *byteCodeGen,ParseNode *functionNode)

{
  FunctionBody *functionWrite;
  ByteCodeWriter *this;
  undefined1 local_30 [8];
  AutoCleanup autoCleanup;
  
  ParseableFunctionInfo::SetGrfscr(funcInfo->byteCodeFunction,byteCodeGen->flags);
  ParseableFunctionInfo::SetSourceInfo
            (funcInfo->byteCodeFunction,byteCodeGen->sourceIndex,funcInfo->root,
             (bool)((byte)(byteCodeGen->flags >> 0xb) & 1),(byteCodeGen->flags & 0x820) == 0x20);
  functionWrite = FunctionProxy::GetFunctionBody(&funcInfo->byteCodeFunction->super_FunctionProxy);
  this = &byteCodeGen->m_writer;
  local_30 = (undefined1  [8])functionWrite;
  autoCleanup.mFunctionBody = (FunctionBody *)byteCodeGen;
  ByteCodeWriter::Begin(this,functionWrite,byteCodeGen->alloc,false,false,false);
  ByteCodeWriter::StartStatement(this,functionNode,0);
  ByteCodeWriter::Empty(this,Nop);
  ByteCodeWriter::EndStatement(this,functionNode);
  ByteCodeWriter::End(this);
  FunctionBody::CheckAndSetConstantCount(functionWrite,2);
  local_30 = (undefined1  [8])0x0;
  EmitEmptyByteCode::AutoCleanup::~AutoCleanup((AutoCleanup *)local_30);
  return;
}

Assistant:

void AsmJSByteCodeGenerator::EmitEmptyByteCode(FuncInfo * funcInfo, ByteCodeGenerator * byteCodeGen, ParseNode * functionNode)
    {
        funcInfo->byteCodeFunction->SetGrfscr(byteCodeGen->GetFlags());
        funcInfo->byteCodeFunction->SetSourceInfo(byteCodeGen->GetCurrentSourceIndex(),
            funcInfo->root,
            !!(byteCodeGen->GetFlags() & fscrEvalCode),
            ((byteCodeGen->GetFlags() & fscrDynamicCode) && !(byteCodeGen->GetFlags() & fscrEvalCode)));

        FunctionBody * functionBody = funcInfo->byteCodeFunction->GetFunctionBody();

        class AutoCleanup
        {
        private:
            FunctionBody * mFunctionBody;
            ByteCodeGenerator * mByteCodeGen;
        public:
            AutoCleanup(FunctionBody * functionBody, ByteCodeGenerator * byteCodeGen) : mFunctionBody(functionBody), mByteCodeGen(byteCodeGen)
            {
            }

            void Done()
            {
                mFunctionBody = nullptr;
            }
            ~AutoCleanup()
            {
                if (mFunctionBody)
                {
                    mFunctionBody->ResetByteCodeGenState();
                    mByteCodeGen->Writer()->Reset();
                }
            }
        } autoCleanup(functionBody, byteCodeGen);

        byteCodeGen->Writer()->Begin(functionBody, byteCodeGen->GetAllocator(), false, false, false);
        byteCodeGen->Writer()->StartStatement(functionNode, 0);
        byteCodeGen->Writer()->Empty(OpCode::Nop);
        byteCodeGen->Writer()->EndStatement(functionNode);
        byteCodeGen->Writer()->End();

        functionBody->CheckAndSetConstantCount(FuncInfo::InitialConstRegsCount);

        autoCleanup.Done();
    }